

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::capacitor_allocation(Graph *this)

{
  double dVar1;
  double dVar2;
  pointer pCVar3;
  double dVar4;
  double *pdVar5;
  Vertex *this_00;
  Capacitor local_78;
  undefined8 local_48;
  double dStack_40;
  vector<double,_std::allocator<double>_> local_38;
  
  pCVar3 = (this->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = *(undefined8 *)pCVar3;
  dStack_40 = pCVar3->cost;
  std::vector<double,_std::allocator<double>_>::vector(&local_38,&pCVar3->powerSteps);
  dVar4 = dStack_40;
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  evaluateLossesAndFlows(this,1e-12,1);
  getTotalLoss(this);
  pdVar5 = getTotalLoss(this);
  do {
    dVar1 = pdVar5[1];
    this_00 = greedyCapacitorAllocation(this);
    pCVar3 = (this->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_78.id = pCVar3->id;
    local_78._4_4_ = *(undefined4 *)&pCVar3->field_0x4;
    local_78.cost = pCVar3->cost;
    std::vector<double,_std::allocator<double>_>::vector(&local_78.powerSteps,&pCVar3->powerSteps);
    Vertex::addCapacitor(this_00,&local_78);
    if (local_78.powerSteps.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.powerSteps.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.powerSteps.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.powerSteps.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    evaluateLossesAndFlows(this,1e-12,1);
    pdVar5 = getTotalLoss(this);
    dVar2 = pdVar5[1];
    getTotalLoss(this);
    pdVar5 = getTotalLoss(this);
  } while (dVar4 < dVar1 - dVar2);
  Vertex::rmLastCapacitor(this_00);
  return;
}

Assistant:

void Graph::capacitor_allocation(){
    int idLoad = 1;
    double capacitor_cost = this->getCapacitorType(1).getCost();   // Custo do capacitor em kW
    this->evaluateLossesAndFlows(1e-12, idLoad);                   // Avalia no nível de carga mais pesado?

    double * last_loss_cost = new double[2];
    last_loss_cost[0] = this->getTotalLoss()[0];
    last_loss_cost[1] = this->getTotalLoss()[1];
    double cost_change = capacitor_cost*2;

//    uint iter = 0;
    Vertex * alloc_vertex ;
    while( capacitor_cost < cost_change ) {
        alloc_vertex = this->greedyCapacitorAllocation();
//        cout << "Vertice cap: " << alloc_vertex->getID() << endl;
        alloc_vertex->addCapacitor( this->getCapacitorType(1) );
        this->evaluateLossesAndFlows(1e-12, idLoad);
        cost_change = last_loss_cost[1] - this->getTotalLoss()[1];
//        cout << "  Total Loss:  " << graph->getTotalLoss()[0] << "KW"  << endl;
//        cout << "  Total Cost:  " << graph->getTotalLoss()[1] << "US$"  << endl;
//        cout << "  Loss Change: " << last_loss_cost[0] - this->getTotalLoss()[0] << "KW"  << endl;
//        cout << "  Cost Change: " << cost_change  << " US$"     << endl;
        last_loss_cost[0] = this->getTotalLoss()[0];
        last_loss_cost[1] = this->getTotalLoss()[1];
//        iter++;
    }

    alloc_vertex->rmLastCapacitor();
//    iter--;
//    cout << "Num caps: " << iter << endl;
}